

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EcMasterlibMain.cpp
# Opt level: O1

void callbackFct(EC_T_BYTE *pbyPDInPtr,EC_T_BYTE *pbyPDOutPtr)

{
  int iVar1;
  EcMasterlibMain *pEVar2;
  uint uVar3;
  bool bVar4;
  unique_lock<std::mutex> lk2;
  unique_lock<std::mutex> local_30;
  
  pEVar2 = ecmasterlib::EcMasterlibMain::instance;
  if (callbackFct::counter < 0xc9) goto LAB_001464e0;
  if ((ecmasterlib::EcMasterlibMain::instance->lockInBuffer).lockCount == 0) {
LAB_00146493:
    memcpy(pEVar2->inBuffer,pbyPDInPtr,(long)pEVar2->bufferSize);
  }
  else {
    uVar3 = 0;
    do {
      usleep(1);
      iVar1 = (pEVar2->lockInBuffer).lockCount;
      if (iVar1 == 0) break;
      bVar4 = uVar3 < 99;
      uVar3 = uVar3 + 1;
    } while (bVar4);
    if (iVar1 < 1) goto LAB_00146493;
  }
  if ((pEVar2->lockOutBuffer).lockCount != 0) {
    uVar3 = 0;
    do {
      usleep(1);
      iVar1 = (pEVar2->lockOutBuffer).lockCount;
      if (iVar1 == 0) break;
      bVar4 = uVar3 < 99;
      uVar3 = uVar3 + 1;
    } while (bVar4);
    if (0 < iVar1) goto LAB_001464e0;
  }
  memcpy(pbyPDOutPtr,pEVar2->outBuffer,(long)pEVar2->bufferSize);
LAB_001464e0:
  if (callbackFct::counter < 10000) {
    callbackFct::counter = callbackFct::counter + 1;
  }
  std::condition_variable::notify_one();
  if (pEVar2->waitForEeros == true) {
    if (callbackFct(unsigned_char*,unsigned_char*)::startedWaitingComunicated == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "waiting--------------------------------------------------------",0x3f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      callbackFct(unsigned_char*,unsigned_char*)::startedWaitingComunicated = '\x01';
    }
    local_30._M_owns = false;
    local_30._M_device = &pEVar2->m2;
    std::unique_lock<std::mutex>::lock(&local_30);
    local_30._M_owns = true;
    std::condition_variable::wait((unique_lock *)&pEVar2->cv2);
    std::unique_lock<std::mutex>::unlock(&local_30);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  return;
}

Assistant:

EcMasterlibMain* EcMasterlibMain::getInstance() {
	return instance;
}